

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_p_race(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_p_race_name);
  parser_reg(p,"stats int str int int int wis int dex int con",parse_p_race_stats);
  parser_reg(p,"skill-disarm-phys int disarm",parse_p_race_skill_disarm_phys);
  parser_reg(p,"skill-disarm-magic int disarm",parse_p_race_skill_disarm_magic);
  parser_reg(p,"skill-device int device",parse_p_race_skill_device);
  parser_reg(p,"skill-save int save",parse_p_race_skill_save);
  parser_reg(p,"skill-stealth int stealth",parse_p_race_skill_stealth);
  parser_reg(p,"skill-search int search",parse_p_race_skill_search);
  parser_reg(p,"skill-melee int melee",parse_p_race_skill_melee);
  parser_reg(p,"skill-shoot int shoot",parse_p_race_skill_shoot);
  parser_reg(p,"skill-throw int throw",parse_p_race_skill_throw);
  parser_reg(p,"skill-dig int dig",parse_p_race_skill_dig);
  parser_reg(p,"hitdie int mhp",parse_p_race_hitdie);
  parser_reg(p,"exp int exp",parse_p_race_exp);
  parser_reg(p,"infravision int infra",parse_p_race_infravision);
  parser_reg(p,"history uint hist",parse_p_race_history);
  parser_reg(p,"age int base_age int mod_age",parse_p_race_age);
  parser_reg(p,"height int base_hgt int mod_hgt",parse_p_race_height);
  parser_reg(p,"weight int base_wgt int mod_wgt",parse_p_race_weight);
  parser_reg(p,"obj-flags ?str flags",parse_p_race_obj_flags);
  parser_reg(p,"player-flags ?str flags",parse_p_race_play_flags);
  parser_reg(p,"values str values",parse_p_race_values);
  return p;
}

Assistant:

static struct parser *init_parse_p_race(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_p_race_name);
	parser_reg(p, "stats int str int int int wis int dex int con", parse_p_race_stats);
	parser_reg(p, "skill-disarm-phys int disarm", parse_p_race_skill_disarm_phys);
	parser_reg(p, "skill-disarm-magic int disarm", parse_p_race_skill_disarm_magic);
	parser_reg(p, "skill-device int device", parse_p_race_skill_device);
	parser_reg(p, "skill-save int save", parse_p_race_skill_save);
	parser_reg(p, "skill-stealth int stealth", parse_p_race_skill_stealth);
	parser_reg(p, "skill-search int search", parse_p_race_skill_search);
	parser_reg(p, "skill-melee int melee", parse_p_race_skill_melee);
	parser_reg(p, "skill-shoot int shoot", parse_p_race_skill_shoot);
	parser_reg(p, "skill-throw int throw", parse_p_race_skill_throw);
	parser_reg(p, "skill-dig int dig", parse_p_race_skill_dig);
	parser_reg(p, "hitdie int mhp", parse_p_race_hitdie);
	parser_reg(p, "exp int exp", parse_p_race_exp);
	parser_reg(p, "infravision int infra", parse_p_race_infravision);
	parser_reg(p, "history uint hist", parse_p_race_history);
	parser_reg(p, "age int base_age int mod_age", parse_p_race_age);
	parser_reg(p, "height int base_hgt int mod_hgt", parse_p_race_height);
	parser_reg(p, "weight int base_wgt int mod_wgt", parse_p_race_weight);
	parser_reg(p, "obj-flags ?str flags", parse_p_race_obj_flags);
	parser_reg(p, "player-flags ?str flags", parse_p_race_play_flags);
	parser_reg(p, "values str values", parse_p_race_values);
	return p;
}